

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

size_t strarray_get_count(strarray *array)

{
  size_t sVar1;
  char *__s;
  size_t sVar2;
  char *pcVar3;
  
  __s = array->value;
  if ((__s == (char *)0x0) || (pcVar3 = __s + array->length, pcVar3 <= __s)) {
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    do {
      sVar2 = sVar2 + 1;
      sVar1 = strlen(__s);
      __s = __s + sVar1 + 1;
    } while (__s < pcVar3);
  }
  return sVar2;
}

Assistant:

size_t
strarray_get_count(const struct strarray *array) {
  size_t count = 0;
  char *ptr;

  strarray_for_each_element(array, ptr) {
    count++;
  }
  return count;
}